

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

void __thiscall btSoftBody::staticSolve(btSoftBody *this,int iterations)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  
  if (0 < iterations) {
    uVar1 = (ulong)(uint)(this->m_cfg).m_psequence.m_size;
    iVar3 = 0;
    do {
      if (0 < (int)uVar1) {
        lVar2 = 0;
        do {
          (*(code *)(&PTR_PSolve_Links_00221518)[(int)(this->m_cfg).m_psequence.m_data[lVar2]])
                    (0x3f800000,0,this);
          lVar2 = lVar2 + 1;
          uVar1 = (ulong)(this->m_cfg).m_psequence.m_size;
        } while (lVar2 < (long)uVar1);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != iterations);
  }
  return;
}

Assistant:

void			btSoftBody::staticSolve(int iterations)
{
	for(int isolve=0;isolve<iterations;++isolve)
	{
		for(int iseq=0;iseq<m_cfg.m_psequence.size();++iseq)
		{
			getSolver(m_cfg.m_psequence[iseq])(this,1,0);
		}
	}
}